

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

VarStatus __thiscall soplex::SoPlexBase<double>::basisColStatus(SoPlexBase<double> *this,int col)

{
  bool bVar1;
  int iVar2;
  VarStatus VVar3;
  VarStatus *pVVar4;
  int in_ESI;
  SoPlexBase<double> *in_RDI;
  SoPlexBase<double> *this_00;
  Real RVar5;
  double dVar6;
  undefined8 in_stack_ffffffffffffffc8;
  int col_00;
  SoPlexBase<double> *in_stack_ffffffffffffffd0;
  
  col_00 = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  if ((in_ESI < 0) || (iVar2 = numCols((SoPlexBase<double> *)0x1d9fe0), iVar2 <= in_ESI)) {
    return ZERO;
  }
  bVar1 = hasBasis(in_RDI);
  if (bVar1) {
    if ((in_RDI->_isRealLPLoaded & 1U) != 0) {
      VVar3 = SPxSolverBase<double>::getBasisColStatus
                        ((SPxSolverBase<double> *)in_stack_ffffffffffffffd0,col_00);
      return VVar3;
    }
    pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                       (&in_RDI->_basisStatusCols,in_ESI);
    return *pVVar4;
  }
  this_00 = (SoPlexBase<double> *)lowerReal(in_stack_ffffffffffffffd0,col_00);
  RVar5 = realParam(in_RDI,INFTY);
  if (-RVar5 < (double)this_00) {
    return ON_LOWER;
  }
  dVar6 = upperReal(this_00,col_00);
  RVar5 = realParam(in_RDI,INFTY);
  if (dVar6 < RVar5) {
    return ON_UPPER;
  }
  return ZERO;
}

Assistant:

typename SPxSolverBase<R>::VarStatus SoPlexBase<R>::basisColStatus(int col) const
{
   assert(col >= 0);
   assert(col < numCols());

   // if index is out of range, return nonbasic status as for a newly added unbounded column
   if(col < 0 || col >= numCols())
   {
      return SPxSolverBase<R>::ZERO;
   }
   // if no basis is available, return slack basis
   else if(!hasBasis())
   {
      if(lowerReal(col) > -realParam(SoPlexBase<R>::INFTY))
         return SPxSolverBase<R>::ON_LOWER;
      else if(upperReal(col) < realParam(SoPlexBase<R>::INFTY))
         return SPxSolverBase<R>::ON_UPPER;
      else
         return SPxSolverBase<R>::ZERO;
   }
   // if the real LP is loaded, ask solver
   else if(_isRealLPLoaded)
   {
      return _solver.getBasisColStatus(col);
   }
   // if the real LP is not loaded, the basis is stored in the basis arrays of this class
   else
   {
      assert(col < _basisStatusCols.size());
      return _basisStatusCols[col];
   }
}